

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

void __thiscall CVmObjStringBuffer::save_to_file(CVmObjStringBuffer *this,CVmFile *fp)

{
  int iVar1;
  int *piVar2;
  uint32_t tmp;
  long lVar3;
  char b [4];
  char b_1 [4];
  char b_2 [4];
  undefined2 local_36;
  int local_34;
  int local_30;
  int local_2c;
  
  piVar2 = (int *)(this->super_CVmObject).ext_;
  local_34 = piVar2[1];
  CVmFile::write_bytes(fp,(char *)&local_34,4);
  local_30 = piVar2[2];
  CVmFile::write_bytes(fp,(char *)&local_30,4);
  local_2c = *piVar2;
  CVmFile::write_bytes(fp,(char *)&local_2c,4);
  iVar1 = *piVar2;
  if (iVar1 != 0) {
    lVar3 = 0;
    do {
      local_36 = (undefined2)piVar2[lVar3 + 3];
      CVmFile::write_bytes(fp,(char *)&local_36,2);
      lVar3 = lVar3 + 1;
    } while (iVar1 != (int)lVar3);
  }
  return;
}

Assistant:

void CVmObjStringBuffer::save_to_file(VMG_ class CVmFile *fp)
{
    vm_strbuf_ext *ext = get_ext();

    /* write our allocation and string length data */
    fp->write_uint4(ext->alo);
    fp->write_uint4(ext->inc);
    fp->write_uint4(ext->len);

    /* write the string contents */
    const wchar_t *src;
    int i;
    for (i = ext->len, src = ext->buf ; i != 0 ; --i)
        fp->write_uint2(*src++);
}